

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

world_ptr __thiscall
APhyBullet::BulletEngine::createDynamicsWorld
          (BulletEngine *this,collision_dispatcher_ref *collision_dispatcher,
          broadphase_ref *broadphase,constraint_solver_ref *constraint_solver,
          collision_configuration_ref *collision_configuration)

{
  btDiscreteDynamicsWorld *this_00;
  BulletWorld *this_01;
  world_ptr prVar1;
  
  prVar1 = (world_ptr)0x0;
  if (((collision_dispatcher->counter != (Counter *)0x0) &&
      (constraint_solver->counter != (Counter *)0x0)) &&
     (collision_configuration->counter != (Counter *)0x0)) {
    this_00 = (btDiscreteDynamicsWorld *)btAlignedAllocInternal(0x1c8,0x10);
    btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
              (this_00,(btDispatcher *)
                       collision_dispatcher->counter->object[1].super_base_interface.
                       _vptr_base_interface,
               (btBroadphaseInterface *)
               broadphase->counter->object[1].super_base_interface._vptr_base_interface,
               (btConstraintSolver *)
               constraint_solver->counter->object[1].super_base_interface._vptr_base_interface,
               (btCollisionConfiguration *)
               collision_configuration->counter->object[1].super_base_interface._vptr_base_interface
              );
    this_01 = (BulletWorld *)operator_new(0xb8);
    BulletWorld::BulletWorld(this_01,(btDynamicsWorld *)this_00);
    prVar1 = (world_ptr)operator_new(0x18);
    prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
    prVar1->object = (world *)this_01;
    prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
    prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
    (this_01->super_world).super_base_interface.myRefCounter = prVar1;
    aphy::ref<aphy::collision_dispatcher>::operator=
              (&this_01->collisionDispatcher,collision_dispatcher);
    aphy::ref<aphy::broadphase>::operator=(&this_01->broadphase,broadphase);
    aphy::ref<aphy::constraint_solver>::operator=(&this_01->constraintSolver,constraint_solver);
    aphy::ref<aphy::collision_configuration>::operator=
              (&this_01->collisionConfiguration,collision_configuration);
  }
  return prVar1;
}

Assistant:

world_ptr BulletEngine::createDynamicsWorld(const collision_dispatcher_ref &collision_dispatcher, const broadphase_ref &broadphase, const constraint_solver_ref &constraint_solver, const collision_configuration_ref &collision_configuration)
{
    if(!collision_dispatcher)
        return nullptr;
    if(!constraint_solver)
        return nullptr;
    if(!collision_configuration)
        return nullptr;

    auto result = makeObject<BulletWorld> (
        new btDiscreteDynamicsWorld(collision_dispatcher.as<BulletCollisionDispatcher>()->handle,
            broadphase.as<BulletBroadphase>()->handle,
            constraint_solver.as<BulletConstraintSolver>()->handle,
            collision_configuration.as<BulletCollisionConfiguration>()->handle));

    auto world = result.as<BulletWorld> ();
    world->collisionDispatcher = collision_dispatcher;
    world->broadphase = broadphase;
    world->constraintSolver = constraint_solver;
    world->collisionConfiguration = collision_configuration;
    return result.disown();
}